

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CServer::Init(CServer *this)

{
  long in_RDI;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 0x40; local_c = local_c + 1) {
    *(undefined4 *)(in_RDI + 0x38 + (long)local_c * 0x195f0) = 0;
    *(undefined1 *)(in_RDI + (long)local_c * 0x195f0 + 0x19588) = 0;
    *(undefined1 *)(in_RDI + (long)local_c * 0x195f0 + 0x195c9) = 0;
    *(undefined4 *)(in_RDI + (long)local_c * 0x195f0 + 0x19600) = 0xffffffff;
    CSnapshotStorage::Init((CSnapshotStorage *)(in_RDI + (long)local_c * 0x195f0 + 0x50));
  }
  *(undefined4 *)(in_RDI + 0x10) = 0;
  return 0;
}

Assistant:

int CServer::Init()
{
	for(int i = 0; i < MAX_CLIENTS; i++)
	{
		m_aClients[i].m_State = CClient::STATE_EMPTY;
		m_aClients[i].m_aName[0] = 0;
		m_aClients[i].m_aClan[0] = 0;
		m_aClients[i].m_Country = -1;
		m_aClients[i].m_Snapshots.Init();
	}

	m_CurrentGameTick = 0;

	return 0;
}